

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O1

UResourceDataEntry * init_entry(char *localeID,char *path,UErrorCode *status)

{
  int32_t *piVar1;
  Resource res;
  UResourceDataEntry *entry;
  size_t sVar2;
  char *__dest;
  char *pcVar3;
  UResourceDataEntry *pUVar4;
  UChar *us;
  ResourceData *pResData;
  int32_t aliasLen;
  UErrorCode cacheStatus;
  char aliasName [100];
  UResourceDataEntry find;
  int32_t local_110;
  UErrorCode local_10c;
  char local_108 [104];
  char *local_a0;
  char *local_98;
  
  local_108[0x60] = '\0';
  local_108[0x61] = '\0';
  local_108[0x62] = '\0';
  local_108[99] = '\0';
  local_108[0x50] = '\0';
  local_108[0x51] = '\0';
  local_108[0x52] = '\0';
  local_108[0x53] = '\0';
  local_108[0x54] = '\0';
  local_108[0x55] = '\0';
  local_108[0x56] = '\0';
  local_108[0x57] = '\0';
  local_108[0x58] = '\0';
  local_108[0x59] = '\0';
  local_108[0x5a] = '\0';
  local_108[0x5b] = '\0';
  local_108[0x5c] = '\0';
  local_108[0x5d] = '\0';
  local_108[0x5e] = '\0';
  local_108[0x5f] = '\0';
  local_108[0x40] = '\0';
  local_108[0x41] = '\0';
  local_108[0x42] = '\0';
  local_108[0x43] = '\0';
  local_108[0x44] = '\0';
  local_108[0x45] = '\0';
  local_108[0x46] = '\0';
  local_108[0x47] = '\0';
  local_108[0x48] = '\0';
  local_108[0x49] = '\0';
  local_108[0x4a] = '\0';
  local_108[0x4b] = '\0';
  local_108[0x4c] = '\0';
  local_108[0x4d] = '\0';
  local_108[0x4e] = '\0';
  local_108[0x4f] = '\0';
  local_108[0x30] = '\0';
  local_108[0x31] = '\0';
  local_108[0x32] = '\0';
  local_108[0x33] = '\0';
  local_108[0x34] = '\0';
  local_108[0x35] = '\0';
  local_108[0x36] = '\0';
  local_108[0x37] = '\0';
  local_108[0x38] = '\0';
  local_108[0x39] = '\0';
  local_108[0x3a] = '\0';
  local_108[0x3b] = '\0';
  local_108[0x3c] = '\0';
  local_108[0x3d] = '\0';
  local_108[0x3e] = '\0';
  local_108[0x3f] = '\0';
  local_108[0x20] = '\0';
  local_108[0x21] = '\0';
  local_108[0x22] = '\0';
  local_108[0x23] = '\0';
  local_108[0x24] = '\0';
  local_108[0x25] = '\0';
  local_108[0x26] = '\0';
  local_108[0x27] = '\0';
  local_108[0x28] = '\0';
  local_108[0x29] = '\0';
  local_108[0x2a] = '\0';
  local_108[0x2b] = '\0';
  local_108[0x2c] = '\0';
  local_108[0x2d] = '\0';
  local_108[0x2e] = '\0';
  local_108[0x2f] = '\0';
  local_108[0x10] = '\0';
  local_108[0x11] = '\0';
  local_108[0x12] = '\0';
  local_108[0x13] = '\0';
  local_108[0x14] = '\0';
  local_108[0x15] = '\0';
  local_108[0x16] = '\0';
  local_108[0x17] = '\0';
  local_108[0x18] = '\0';
  local_108[0x19] = '\0';
  local_108[0x1a] = '\0';
  local_108[0x1b] = '\0';
  local_108[0x1c] = '\0';
  local_108[0x1d] = '\0';
  local_108[0x1e] = '\0';
  local_108[0x1f] = '\0';
  local_108[0] = '\0';
  local_108[1] = '\0';
  local_108[2] = '\0';
  local_108[3] = '\0';
  local_108[4] = '\0';
  local_108[5] = '\0';
  local_108[6] = '\0';
  local_108[7] = '\0';
  local_108[8] = '\0';
  local_108[9] = '\0';
  local_108[10] = '\0';
  local_108[0xb] = '\0';
  local_108[0xc] = '\0';
  local_108[0xd] = '\0';
  local_108[0xe] = '\0';
  local_108[0xf] = '\0';
  local_110 = 0;
  if (U_ZERO_ERROR < *status) {
    return (UResourceDataEntry *)0x0;
  }
  if (localeID == (char *)0x0) {
    pcVar3 = uloc_getDefault_63();
  }
  else {
    pcVar3 = "root";
    if (*localeID != '\0') {
      pcVar3 = localeID;
    }
  }
  local_a0 = pcVar3;
  local_98 = path;
  entry = (UResourceDataEntry *)uhash_get_63(cache,&local_a0);
  if (entry == (UResourceDataEntry *)0x0) {
    entry = (UResourceDataEntry *)uprv_malloc_63(0x78);
    if (entry == (UResourceDataEntry *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
      return (UResourceDataEntry *)0x0;
    }
    (entry->fData).noFallback = '\0';
    (entry->fData).isPoolBundle = '\0';
    (entry->fData).usesPoolBundle = '\0';
    (entry->fData).useNativeStrcmp = '\0';
    *(undefined4 *)&(entry->fData).field_0x3c = 0;
    entry->fNameBuffer[0] = '\0';
    entry->fNameBuffer[1] = '\0';
    entry->fNameBuffer[2] = '\0';
    entry->field_0x6b = 0;
    entry->fCountExisting = 0;
    (entry->fData).poolBundleStrings = (uint16_t *)0x0;
    (entry->fData).poolStringIndexLimit = 0;
    (entry->fData).poolStringIndex16Limit = 0;
    (entry->fData).poolBundleKeys = (char *)0x0;
    (entry->fData).rootRes = 0;
    (entry->fData).localKeyLimit = 0;
    (entry->fData).pRoot = (int32_t *)0x0;
    (entry->fData).p16BitUnits = (uint16_t *)0x0;
    entry->fPool = (UResourceDataEntry *)0x0;
    (entry->fData).data = (UDataMemory *)0x0;
    entry->fParent = (UResourceDataEntry *)0x0;
    entry->fAlias = (UResourceDataEntry *)0x0;
    entry->fName = (char *)0x0;
    entry->fPath = (char *)0x0;
    *(undefined8 *)&entry->fBogus = 0;
    sVar2 = strlen(pcVar3);
    if ((int)sVar2 < 3) {
      __dest = entry->fNameBuffer;
    }
    else {
      __dest = (char *)uprv_malloc_63((ulong)((int)sVar2 + 1));
    }
    entry->fName = __dest;
    if (__dest == (char *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      strcpy(__dest,pcVar3);
    }
    if (U_ZERO_ERROR < *status) {
LAB_001b0794:
      uprv_free_63(entry);
      return (UResourceDataEntry *)0x0;
    }
    if (path != (char *)0x0) {
      pcVar3 = uprv_strdup_63(path);
      entry->fPath = pcVar3;
      if (pcVar3 == (char *)0x0) {
        *status = U_MEMORY_ALLOCATION_ERROR;
        goto LAB_001b0794;
      }
    }
    pResData = &entry->fData;
    res_load_63(pResData,entry->fPath,entry->fName,status);
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      if ((entry->fData).usesPoolBundle != '\0') {
        pUVar4 = getPoolEntry(entry->fPath,status);
        entry->fPool = pUVar4;
        if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
          piVar1 = (pUVar4->fData).pRoot;
          if ((entry->fData).pRoot[8] == piVar1[8]) {
            (entry->fData).poolBundleKeys = (char *)(piVar1 + (ulong)*(byte *)(piVar1 + 1) + 1);
            (entry->fData).poolBundleStrings = (pUVar4->fData).p16BitUnits;
          }
          else {
            *status = U_INVALID_FORMAT_ERROR;
            entry->fBogus = U_INVALID_FORMAT_ERROR;
          }
        }
        else {
          entry->fBogus = *status;
        }
      }
      if (((*status < U_ILLEGAL_ARGUMENT_ERROR) &&
          (res = res_getResource_63(pResData,"%%ALIAS"), res != 0xffffffff)) &&
         (us = res_getString_63(pResData,res,&local_110), 0 < local_110 && us != (UChar *)0x0)) {
        u_UCharsToChars_63(us,local_108,local_110 + 1);
        pUVar4 = init_entry(local_108,path,status);
        entry->fAlias = pUVar4;
      }
    }
    else {
      if (*status == U_MEMORY_ALLOCATION_ERROR) goto LAB_001b0794;
      *status = U_ERROR_WARNING_START;
      entry->fBogus = U_ERROR_WARNING_START;
    }
    pUVar4 = (UResourceDataEntry *)uhash_get_63(cache,entry);
    if (pUVar4 == (UResourceDataEntry *)0x0) {
      local_10c = U_ZERO_ERROR;
      uhash_put_63(cache,entry,entry,&local_10c);
      if (U_ZERO_ERROR < local_10c) {
        *status = local_10c;
        free_entry(entry);
        entry = (UResourceDataEntry *)0x0;
      }
    }
    else {
      free_entry(entry);
      entry = pUVar4;
    }
  }
  if (entry == (UResourceDataEntry *)0x0) {
    return (UResourceDataEntry *)0x0;
  }
  do {
    pUVar4 = entry;
    entry = pUVar4->fAlias;
  } while (pUVar4->fAlias != (UResourceDataEntry *)0x0);
  pUVar4->fCountExisting = pUVar4->fCountExisting + 1;
  if (pUVar4->fBogus != U_ZERO_ERROR) {
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      *status = pUVar4->fBogus;
      return pUVar4;
    }
    return pUVar4;
  }
  return pUVar4;
}

Assistant:

static UResourceDataEntry *init_entry(const char *localeID, const char *path, UErrorCode *status) {
    UResourceDataEntry *r = NULL;
    UResourceDataEntry find;
    /*int32_t hashValue;*/
    const char *name;
    char aliasName[100] = { 0 };
    int32_t aliasLen = 0;
    /*UBool isAlias = FALSE;*/
    /*UHashTok hashkey; */

    if(U_FAILURE(*status)) {
        return NULL;
    }

    /* here we try to deduce the right locale name */
    if(localeID == NULL) { /* if localeID is NULL, we're trying to open default locale */
        name = uloc_getDefault();
    } else if(*localeID == 0) { /* if localeID is "" then we try to open root locale */
        name = kRootLocaleName;
    } else { /* otherwise, we'll open what we're given */
        name = localeID;
    }

    find.fName = (char *)name;
    find.fPath = (char *)path;

    /* calculate the hash value of the entry */
    /*hashkey.pointer = (void *)&find;*/
    /*hashValue = hashEntry(hashkey);*/

    /* check to see if we already have this entry */
    r = (UResourceDataEntry *)uhash_get(cache, &find);
    if(r == NULL) {
        /* if the entry is not yet in the hash table, we'll try to construct a new one */
        r = (UResourceDataEntry *) uprv_malloc(sizeof(UResourceDataEntry));
        if(r == NULL) {
            *status = U_MEMORY_ALLOCATION_ERROR;
            return NULL;
        }

        uprv_memset(r, 0, sizeof(UResourceDataEntry));
        /*r->fHashKey = hashValue;*/

        setEntryName(r, name, status);
        if (U_FAILURE(*status)) {
            uprv_free(r);
            return NULL;
        }

        if(path != NULL) {
            r->fPath = (char *)uprv_strdup(path);
            if(r->fPath == NULL) {
                *status = U_MEMORY_ALLOCATION_ERROR;
                uprv_free(r);
                return NULL;
            }
        }

        /* this is the actual loading */
        res_load(&(r->fData), r->fPath, r->fName, status);

        if (U_FAILURE(*status)) {
            /* if we failed to load due to an out-of-memory error, exit early. */
            if (*status == U_MEMORY_ALLOCATION_ERROR) {
                uprv_free(r);
                return NULL;
            }
            /* we have no such entry in dll, so it will always use fallback */
            *status = U_USING_FALLBACK_WARNING;
            r->fBogus = U_USING_FALLBACK_WARNING;
        } else { /* if we have a regular entry */
            Resource aliasres;
            if (r->fData.usesPoolBundle) {
                r->fPool = getPoolEntry(r->fPath, status);
                if (U_SUCCESS(*status)) {
                    const int32_t *poolIndexes = r->fPool->fData.pRoot + 1;
                    if(r->fData.pRoot[1 + URES_INDEX_POOL_CHECKSUM] == poolIndexes[URES_INDEX_POOL_CHECKSUM]) {
                        r->fData.poolBundleKeys = (const char *)(poolIndexes + (poolIndexes[URES_INDEX_LENGTH] & 0xff));
                        r->fData.poolBundleStrings = r->fPool->fData.p16BitUnits;
                    } else {
                        r->fBogus = *status = U_INVALID_FORMAT_ERROR;
                    }
                } else {
                    r->fBogus = *status;
                }
            }
            if (U_SUCCESS(*status)) {
                /* handle the alias by trying to get out the %%Alias tag.*/
                /* We'll try to get alias string from the bundle */
                aliasres = res_getResource(&(r->fData), "%%ALIAS");
                if (aliasres != RES_BOGUS) {
                    const UChar *alias = res_getString(&(r->fData), aliasres, &aliasLen);
                    if(alias != NULL && aliasLen > 0) { /* if there is actual alias - unload and load new data */
                        u_UCharsToChars(alias, aliasName, aliasLen+1);
                        r->fAlias = init_entry(aliasName, path, status);
                    }
                }
            }
        }

        {
            UResourceDataEntry *oldR = NULL;
            if((oldR = (UResourceDataEntry *)uhash_get(cache, r)) == NULL) { /* if the data is not cached */
                /* just insert it in the cache */
                UErrorCode cacheStatus = U_ZERO_ERROR;
                uhash_put(cache, (void *)r, r, &cacheStatus);
                if (U_FAILURE(cacheStatus)) {
                    *status = cacheStatus;
                    free_entry(r);
                    r = NULL;
                }
            } else {
                /* somebody have already inserted it while we were working, discard newly opened data */
                /* Also, we could get here IF we opened an alias */
                free_entry(r);
                r = oldR;
            }
        }

    }
    if(r != NULL) {
        /* return the real bundle */
        while(r->fAlias != NULL) {
            r = r->fAlias;
        }
        r->fCountExisting++; /* we increase its reference count */
        /* if the resource has a warning */
        /* we don't want to overwrite a status with no error */
        if(r->fBogus != U_ZERO_ERROR && U_SUCCESS(*status)) {
             *status = r->fBogus; /* set the returning status */
        }
    }
    return r;
}